

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void embree::SceneGraph::set_time_range(Ref<embree::SceneGraph::Node> *node,BBox1f *time_range)

{
  Node *pNVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  ulong uVar13;
  Ref<embree::SceneGraph::Node> local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (plVar2 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar3 = (long *)0x0;
    }
    else {
      plVar3 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    if (plVar3 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar4 = (long *)0x0;
      }
      else {
        plVar4 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (plVar4 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          plVar6 = (long *)0x0;
        }
        else {
          plVar6 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        }
        if (plVar6 == (long *)0x0) {
          if (node->ptr == (Node *)0x0) {
            plVar7 = (long *)0x0;
          }
          else {
            plVar7 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          }
          if (plVar7 == (long *)0x0) {
            if (node->ptr == (Node *)0x0) {
              plVar8 = (long *)0x0;
            }
            else {
              plVar8 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GridMeshNode::typeinfo,0);
            }
            if (plVar8 == (long *)0x0) {
              if (node->ptr == (Node *)0x0) {
                plVar9 = (long *)0x0;
              }
              else {
                plVar9 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&HairSetNode::typeinfo,0);
              }
              if (plVar9 == (long *)0x0) {
                if (node->ptr == (Node *)0x0) {
                  plVar10 = (long *)0x0;
                }
                else {
                  plVar10 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&PointSetNode::typeinfo
                                                   ,0);
                }
                if (plVar10 == (long *)0x0) {
                  if (node->ptr == (Node *)0x0) {
                    plVar11 = (long *)0x0;
                  }
                  else {
                    plVar11 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,
                                                     &SubdivMeshNode::typeinfo,0);
                  }
                  if (plVar11 != (long *)0x0) {
                    (**(code **)(*plVar11 + 0x10))(plVar11);
                    *(float *)(plVar11 + 0xd) = time_range->lower;
                    *(float *)((long)plVar11 + 0x6c) = time_range->upper;
                    (**(code **)(*plVar11 + 0x18))(plVar11);
                  }
                }
                else {
                  (**(code **)(*plVar10 + 0x10))(plVar10);
                  *(float *)(plVar10 + 0xd) = time_range->lower;
                  *(float *)((long)plVar10 + 0x6c) = time_range->upper;
                }
                if (plVar10 != (long *)0x0) {
                  (**(code **)(*plVar10 + 0x18))(plVar10);
                }
              }
              else {
                (**(code **)(*plVar9 + 0x10))();
                *(float *)(plVar9 + 0xd) = time_range->lower;
                *(float *)((long)plVar9 + 0x6c) = time_range->upper;
              }
              if (plVar9 != (long *)0x0) {
                (**(code **)(*plVar9 + 0x18))();
              }
            }
            else {
              (**(code **)(*plVar8 + 0x10))(plVar8);
              *(float *)(plVar8 + 0xd) = time_range->lower;
              *(float *)((long)plVar8 + 0x6c) = time_range->upper;
            }
            if (plVar8 != (long *)0x0) {
              (**(code **)(*plVar8 + 0x18))(plVar8);
            }
          }
          else {
            (**(code **)(*plVar7 + 0x10))(plVar7);
            *(float *)(plVar7 + 0xd) = time_range->lower;
            *(float *)((long)plVar7 + 0x6c) = time_range->upper;
          }
          if (plVar7 != (long *)0x0) {
            (**(code **)(*plVar7 + 0x18))(plVar7);
          }
        }
        else {
          (**(code **)(*plVar6 + 0x10))(plVar6);
          *(float *)(plVar6 + 0xd) = time_range->lower;
          *(float *)((long)plVar6 + 0x6c) = time_range->upper;
        }
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 0x18))(plVar6);
        }
      }
      else {
        (**(code **)(*plVar4 + 0x10))(plVar4);
        lVar5 = plVar4[0xd];
        if (plVar4[0xe] != lVar5) {
          uVar13 = 0;
          do {
            pNVar1 = *(Node **)(lVar5 + uVar13 * 8);
            local_38.ptr = pNVar1;
            if (pNVar1 != (Node *)0x0) {
              (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
            }
            set_time_range(&local_38,time_range);
            if (pNVar1 != (Node *)0x0) {
              (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
            }
            uVar13 = uVar13 + 1;
            lVar5 = plVar4[0xd];
          } while (uVar13 < (ulong)(plVar4[0xe] - lVar5 >> 3));
        }
      }
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x18))();
      }
    }
    else {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      lVar5 = plVar3[0xd];
      if (plVar3[0xe] != lVar5) {
        lVar12 = 4;
        uVar13 = 0;
        do {
          *(float *)(lVar5 + -4 + lVar12) = time_range->lower;
          *(float *)(lVar5 + lVar12) = time_range->upper;
          uVar13 = uVar13 + 1;
          lVar5 = plVar3[0xd];
          lVar12 = lVar12 + 0x30;
        } while (uVar13 < (ulong)((plVar3[0xe] - lVar5 >> 4) * -0x5555555555555555));
      }
    }
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x18))(plVar3);
    }
  }
  else {
    (**(code **)(*plVar2 + 0x10))(plVar2);
    *(float *)(plVar2 + 0xd) = time_range->lower;
    *(float *)((long)plVar2 + 0x6c) = time_range->upper;
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x18))(plVar2);
  }
  return;
}

Assistant:

void SceneGraph::set_time_range(Ref<SceneGraph::Node> node, const BBox1f& time_range)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->spaces.time_range = time_range;
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      for (size_t i = 0; i < xfmNode->spaces.size(); ++i)
        xfmNode->spaces[i].time_range = time_range;
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        set_time_range(groupNode->children[i],time_range);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
      mesh->time_range = time_range;
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) {
      mesh->time_range = time_range;
    }
    else if (Ref<SceneGraph::GridMeshNode> mesh = node.dynamicCast<SceneGraph::GridMeshNode>()) {
      mesh->time_range = time_range;
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) {
      mesh->time_range = time_range;
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>()) {
      mesh->time_range = time_range;
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>()) {
      mesh->time_range = time_range;
    }
  }